

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O0

ostream * operator<<(ostream *os,BigInt *obj)

{
  bool bVar1;
  int iVar2;
  int local_1c;
  int i;
  BigInt *obj_local;
  ostream *os_local;
  
  bVar1 = BigInt::IsNegative(obj);
  if (bVar1) {
    std::operator<<(os,"-");
  }
  for (local_1c = 0; iVar2 = BigInt::getLength(obj), local_1c < iVar2; local_1c = local_1c + 1) {
    iVar2 = BigInt::operator[](obj,(long)local_1c);
    std::ostream::operator<<(os,iVar2);
  }
  return os;
}

Assistant:

ostream &operator<<(ostream &os, const BigInt &obj)
{
    if (obj.IsNegative()) {
        os << "-";
    }
    
    for (int i = 0; i < obj.getLength(); ++i) {
        os << obj[i];
    }
    
    return os;
}